

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# table_test.cc
# Opt level: O2

void __thiscall leveldb::StringSink::~StringSink(StringSink *this)

{
  (this->super_WritableFile)._vptr_WritableFile = (_func_int **)&PTR__StringSink_00173440;
  std::__cxx11::string::_M_dispose();
  WritableFile::~WritableFile(&this->super_WritableFile);
  return;
}

Assistant:

~StringSink() override = default;